

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27b883::PeerManagerImpl::ProcessGetCFilters
          (PeerManagerImpl *this,CNode *node,Peer *peer,DataStream *vRecv)

{
  CConnman *this_00;
  string msg_type;
  void *pvVar1;
  pointer pBVar2;
  uint8_t filter_type;
  uint32_t start_height_00;
  bool bVar3;
  Logger *this_01;
  string *psVar4;
  DataStream *__nbytes;
  pointer args;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  uint *args_1;
  vector<BlockFilter,_std::allocator<BlockFilter>_> filters;
  BlockFilterIndex *filter_index;
  CBlockIndex *stop_index;
  uint32_t start_height;
  long *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  uint256 stop_hash;
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  uint8_t obj;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  stop_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  __nbytes = vRecv;
  DataStream::read(vRecv,(int)&obj,(void *)0x1,(size_t)vRecv);
  filter_type = obj;
  DataStream::read(vRecv,(int)&obj,(void *)0x4,(size_t)__nbytes);
  start_height_00 = _obj;
  start_height = _obj;
  DataStream::read(vRecv,(int)&stop_hash,(void *)0x20,(size_t)__nbytes);
  bVar3 = PrepareBlockFilterRequest
                    (this,node,(Peer *)peer->m_our_services,filter_type,start_height_00,&stop_hash,
                     1000,&stop_index,&filter_index);
  if (bVar3) {
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = BlockFilterIndex::LookupFilterRange(filter_index,start_height_00,stop_index,&filters);
    pBVar2 = filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar3) {
      if (filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
          super__Vector_impl_data._M_start !=
          filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        args = filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
               super__Vector_impl_data._M_start;
        do {
          local_d8 = (long *)&local_c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"cfilter","");
          this_00 = this->m_connman;
          if (local_d8 == (long *)&local_c8) {
            uStack_78 = uStack_c0;
            local_90 = &local_80;
          }
          else {
            local_90 = local_d8;
          }
          local_80 = CONCAT71(uStack_c7,local_c8);
          local_88 = local_d0;
          local_d0 = 0;
          local_c8 = 0;
          msg_type._M_string_length = (size_type)node;
          msg_type._M_dataplus._M_p = (pointer)this;
          msg_type.field_2._M_allocated_capacity =
               (size_type)
               filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
               super__Vector_impl_data._M_start;
          msg_type.field_2._8_8_ =
               filters.super__Vector_base<BlockFilter,_std::allocator<BlockFilter>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_d8 = (long *)&local_c8;
          NetMsg::Make<BlockFilter_const&>
                    ((CSerializedNetMsg *)&obj,(NetMsg *)&local_90,msg_type,args);
          CConnman::PushMessage(this_00,node,(CSerializedNetMsg *)&obj);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._8_8_ != &local_48) {
            operator_delete((void *)local_60._8_8_,local_48._M_allocated_capacity + 1);
          }
          pvVar1 = (void *)CONCAT44(uStack_6c,_obj);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,local_60._M_allocated_capacity - (long)pvVar1);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_d8 != (long *)&local_c8) {
            operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
          }
          args = args + 1;
        } while (args != pBVar2);
      }
    }
    else {
      this_01 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(this_01,NET,Debug);
      if (bVar3) {
        psVar4 = BlockFilterTypeName_abi_cxx11_(filter_type);
        args_1 = (uint *)0x1e7d9c;
        base_blob<256u>::ToString_abi_cxx11_((string *)&obj,&stop_hash);
        logging_function._M_str = "ProcessGetCFilters";
        logging_function._M_len = 0x12;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x5b;
        LogPrintf_<std::__cxx11::string,unsigned_int,std::__cxx11::string>
                  (logging_function,source_file,0xdc5,IPC|REINDEX|SELECTCOINS|ADDRMAN|ZMQ|HTTP|NET,
                   (Level)psVar4,(char *)&start_height,(string *)&obj,args_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_6c,_obj) != &local_60) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_6c,_obj),(ulong)(local_60._M_allocated_capacity + 1));
        }
      }
    }
    std::vector<BlockFilter,_std::allocator<BlockFilter>_>::~vector(&filters);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::ProcessGetCFilters(CNode& node, Peer& peer, DataStream& vRecv)
{
    uint8_t filter_type_ser;
    uint32_t start_height;
    uint256 stop_hash;

    vRecv >> filter_type_ser >> start_height >> stop_hash;

    const BlockFilterType filter_type = static_cast<BlockFilterType>(filter_type_ser);

    const CBlockIndex* stop_index;
    BlockFilterIndex* filter_index;
    if (!PrepareBlockFilterRequest(node, peer, filter_type, start_height, stop_hash,
                                   MAX_GETCFILTERS_SIZE, stop_index, filter_index)) {
        return;
    }

    std::vector<BlockFilter> filters;
    if (!filter_index->LookupFilterRange(start_height, stop_index, filters)) {
        LogDebug(BCLog::NET, "Failed to find block filter in index: filter_type=%s, start_height=%d, stop_hash=%s\n",
                     BlockFilterTypeName(filter_type), start_height, stop_hash.ToString());
        return;
    }

    for (const auto& filter : filters) {
        MakeAndPushMessage(node, NetMsgType::CFILTER, filter);
    }
}